

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O1

void set_initial_lda_wrapper<sparse_parameters>::func(weight *w,initial_weights *iw,uint64_t index)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  double dVar5;
  uint64_t local_30;
  
  uVar2 = (ulong)iw->_lda;
  if ((iw->_random == true) && (uVar2 != 0)) {
    fVar1 = iw->_initial_random;
    uVar3 = 0;
    local_30 = index;
    do {
      fVar4 = merand48(&local_30);
      dVar5 = log((double)fVar4 + 1e-06);
      w[uVar3] = (float)(1.0 - dVar5) * fVar1;
      uVar3 = uVar3 + 1;
      local_30 = local_30 + 1;
    } while (uVar2 != uVar3);
  }
  w[uVar2] = iw->_initial;
  return;
}

Assistant:

static void func(weight &w, initial_weights &iw, uint64_t index)
  {
    uint32_t lda = iw._lda;
    weight initial_random = iw._initial_random;
    if (iw._random)
    {
      weight *pw = &w;
      for (size_t i = 0; i != lda; ++i, ++index) pw[i] = (float)(-log(merand48(index) + 1e-6) + 1.0f) * initial_random;
    }
    (&w)[lda] = iw._initial;
  }